

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O1

void ximu::PacketConstruction::
     constructReadDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                dest)

{
  uchar uVar1;
  pointer puVar2;
  initializer_list<unsigned_char> __l;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_2_ = 4;
  __l._M_len = 2;
  __l._M_array = (iterator)
                 ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__l,
             (allocator_type *)
             ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + ~(ulong)local_38 == (pointer)0x0) {
    uVar1 = '\0';
  }
  else {
    puVar2 = (pointer)0x0;
    uVar1 = '\0';
    do {
      uVar1 = uVar1 + *(uchar *)((long)local_38 + (long)puVar2);
      puVar2 = puVar2 + 1;
    } while (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + ~(ulong)local_38 != puVar2);
  }
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar1;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_38,
             (long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)local_38,dest);
  if (local_38 != (undefined1  [8])0x0) {
    operator_delete((void *)local_38);
  }
  return;
}

Assistant:

static void constructReadDateTimePacket(OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::READ_DATETIME),
    0 };

  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}